

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O0

string * anon_unknown.dwarf_22748::repeatDelim
                   (string *__return_storage_ptr__,string *str,string *delim,uint cnt)

{
  uint local_60;
  uint i;
  undefined1 local_48 [8];
  string join;
  uint cnt_local;
  string *delim_local;
  string *str_local;
  string *res;
  
  join.field_2._12_4_ = cnt;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,str,
                 delim);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_60 = 1; local_60 < (uint)join.field_2._12_4_; local_60 = local_60 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_48);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)str);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string repeatDelim(std::string str, std::string delim, unsigned int cnt) { // Correct for cnt > 0
		std::string join = str + delim; // Cache
		std::string res;
		res.reserve(str.length()*cnt + delim.length() * (cnt - 1));

		for (unsigned int i = 1; i < cnt; ++i) {
				res += join;
				}

		res += str;
		return res;
		}